

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_filter_block_plane_horz
               (AV1_COMMON *cm,MACROBLOCKD *xd,int plane,MACROBLOCKD_PLANE *plane_ptr,
               uint32_t mi_row,uint32_t mi_col)

{
  byte bVar1;
  int dst_stride;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *dst;
  uint uVar7;
  uint uVar8;
  uint32_t curr_x;
  int y;
  int iVar9;
  AV1_DEBLOCKING_PARAMETERS params;
  
  bVar1 = (byte)plane_ptr->subsampling_x;
  bVar4 = (byte)plane_ptr->subsampling_y;
  uVar8 = (((1 << (bVar4 & 0x1f)) >> 1) + (cm->mi_params).mi_rows >> (bVar4 & 0x1f)) -
          (mi_row >> (bVar4 & 0x1f));
  uVar7 = 0x20 >> (bVar4 & 0x1f);
  if ((int)uVar8 < (int)uVar7) {
    uVar7 = uVar8;
  }
  puVar2 = (plane_ptr->dst).buf;
  dst_stride = (plane_ptr->dst).stride;
  uVar6 = (((1 << (bVar1 & 0x1f)) >> 1) + (cm->mi_params).mi_cols >> (bVar1 & 0x1f)) -
          (mi_col >> (bVar1 & 0x1f));
  uVar8 = 0x20 >> (bVar1 & 0x1f);
  if ((int)uVar6 < (int)uVar8) {
    uVar8 = uVar6;
  }
  uVar5 = 0;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    dst = puVar2 + uVar5 * 4;
    for (iVar9 = 0; iVar9 < (int)uVar7; iVar9 = iVar9 + tx_size_high_unit[bVar3]) {
      params.filter_length = '\0';
      params._1_7_ = 0;
      params.lfthr = (loop_filter_thresh *)0x0;
      bVar3 = set_lpf_parameters(&params,(long)((cm->mi_params).mi_stride << (bVar4 & 0x1f)),cm,xd,
                                 '\x01',(int)uVar5 * 4 + ((mi_col << 2) >> (bVar1 & 0x1f)),
                                 ((mi_row << 2) >> (bVar4 & 0x1f)) + iVar9 * 4,plane,plane_ptr);
      if (bVar3 == 0xff) {
        params._0_8_ = params._0_8_ & 0xffffffffffffff00;
        bVar3 = 0;
      }
      filter_horz(dst,dst_stride,&params,cm->seq_params,'\0');
      dst = dst + (uint)(tx_size_high_unit[bVar3] * dst_stride * 4);
    }
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz(const AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, const int plane,
                                 const MACROBLOCKD_PLANE *const plane_ptr,
                                 const uint32_t mi_row, const uint32_t mi_col) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  const int plane_mi_rows =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_rows, scale_vert);
  const int plane_mi_cols =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, scale_horz);
  const int y_range = AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
                             (MAX_MIB_SIZE >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  for (int x = 0; x < x_range; x++) {
    uint8_t *p = dst_ptr + x * MI_SIZE;
    for (int y = 0; y < y_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will first filter the vertical edge aligned with a 8x8
      // block. If 4x4 transform is used, it will then filter the internal
      // edge aligned with a 4x4 block
      const uint32_t curr_x = ((mi_col * MI_SIZE) >> scale_horz) + x * MI_SIZE;
      const uint32_t curr_y = ((mi_row * MI_SIZE) >> scale_vert) + y * MI_SIZE;
      uint32_t advance_units;
      TX_SIZE tx_size;
      AV1_DEBLOCKING_PARAMETERS params;
      memset(&params, 0, sizeof(params));

      tx_size = set_lpf_parameters(
          &params, (cm->mi_params.mi_stride << scale_vert), cm, xd, HORZ_EDGE,
          curr_x, curr_y, plane, plane_ptr);
      if (tx_size == TX_INVALID) {
        params.filter_length = 0;
        tx_size = TX_4X4;
      }

      filter_horz(p, dst_stride, &params, cm->seq_params, USE_SINGLE);

      // advance the destination pointer
      advance_units = tx_size_high_unit[tx_size];
      y += advance_units;
      p += advance_units * dst_stride * MI_SIZE;
    }
  }
}